

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.h
# Opt level: O2

size_t sdslen(sds s)

{
  switch(s[-1] & 7) {
  case 0:
    return (ulong)((byte)s[-1] >> 3);
  case 1:
    return (ulong)(byte)s[-3];
  case 2:
    return (ulong)*(ushort *)(s + -5);
  case 3:
    return (ulong)*(uint *)(s + -9);
  case 4:
    return *(size_t *)(s + -0x11);
  default:
    return 0;
  }
}

Assistant:

static inline size_t sdslen(const sds s) {
    unsigned char flags = s[-1];
    switch(flags&SDS_TYPE_MASK) {
        case SDS_TYPE_5:
            return SDS_TYPE_5_LEN(flags);
        case SDS_TYPE_8:
            return SDS_HDR(8,s)->len;
        case SDS_TYPE_16:
            return SDS_HDR(16,s)->len;
        case SDS_TYPE_32:
            return SDS_HDR(32,s)->len;
        case SDS_TYPE_64:
            return SDS_HDR(64,s)->len;
    }
    return 0;
}